

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_string_field.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::InlinedStringField::Release_abi_cxx11_(InlinedStringField *this)

{
  string *this_00;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)this);
  (this->field_0).str_._M_string_length = 0;
  **(undefined1 **)&this->field_0 = 0;
  return this_00;
}

Assistant:

std::string* InlinedStringField::Release() {
  auto* released = new std::string(std::move(*get_mutable()));
  get_mutable()->clear();
  return released;
}